

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_len(char *str,int len)

{
  nk_rune local_3c;
  int local_38;
  nk_rune unicode;
  int src_len;
  int glyph_len;
  int text_len;
  int glyphs;
  char *text;
  char *pcStack_18;
  int len_local;
  char *str_local;
  
  glyph_len = 0;
  local_38 = 0;
  text._4_4_ = len;
  pcStack_18 = str;
  if (str != (char *)0x0) {
    if ((str == (char *)0x0) || (len == 0)) {
      str_local._4_4_ = 0;
    }
    else {
      src_len = len;
      _text_len = str;
      unicode = nk_utf_decode(str,&local_3c,len);
      while (unicode != 0 && local_38 < text._4_4_) {
        glyph_len = glyph_len + 1;
        local_38 = local_38 + unicode;
        unicode = nk_utf_decode(_text_len + local_38,&local_3c,src_len - local_38);
      }
      str_local._4_4_ = glyph_len;
    }
    return str_local._4_4_;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x192e,"int nk_utf_len(const char *, int)");
}

Assistant:

NK_API int
nk_utf_len(const char *str, int len)
{
    const char *text;
    int glyphs = 0;
    int text_len;
    int glyph_len;
    int src_len = 0;
    nk_rune unicode;

    NK_ASSERT(str);
    if (!str || !len) return 0;

    text = str;
    text_len = len;
    glyph_len = nk_utf_decode(text, &unicode, text_len);
    while (glyph_len && src_len < len) {
        glyphs++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, &unicode, text_len - src_len);
    }
    return glyphs;
}